

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_parrec
          (CImg<unsigned_char> *this,char *filename,char axis,float align)

{
  CImg<unsigned_char> *this_00;
  CImg<unsigned_char> local_68;
  undefined4 local_48;
  undefined1 local_38 [8];
  CImgList<unsigned_char> list;
  float align_local;
  char axis_local;
  char *filename_local;
  CImg<unsigned_char> *this_local;
  
  list._data._0_4_ = align;
  list._data._7_1_ = axis;
  CImgList<unsigned_char>::CImgList((CImgList<unsigned_char> *)local_38);
  CImgList<unsigned_char>::load_parrec((CImgList<unsigned_char> *)local_38,filename);
  if (local_38._0_4_ == 1) {
    this_00 = CImgList::operator_cast_to_CImg_((CImgList *)local_38);
    this_local = move_to(this_00,this);
  }
  else {
    CImgList<unsigned_char>::get_append
              (&local_68,(CImgList<unsigned_char> *)local_38,list._data._7_1_,list._data._0_4_);
    this_local = assign<unsigned_char>(this,&local_68);
    ~CImg(&local_68);
  }
  local_48 = 1;
  CImgList<unsigned_char>::~CImgList((CImgList<unsigned_char> *)local_38);
  return this_local;
}

Assistant:

CImg<T>& load_parrec(const char *const filename, const char axis='c', const float align=0) {
      CImgList<T> list;
      list.load_parrec(filename);
      if (list._width==1) return list[0].move_to(*this);
      return assign(list.get_append(axis,align));
    }